

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O3

void dec_derive_skip_mv_umve(com_core_t *core,int umve_idx)

{
  com_scu_t *pcVar1;
  s16 (*paasVar2) [2] [2];
  s8 (*pasVar3) [2];
  ushort uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  undefined2 uVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  s8 *psVar14;
  s16 sVar15;
  int iVar16;
  bool bVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  s8 asVar21 [2];
  int iVar22;
  uint uVar23;
  bool bVar24;
  s16 pmv_base_cands [2] [2];
  int neighbor [5];
  byte local_82;
  byte bStack_81;
  s16 local_80 [2];
  s16 local_7c [2];
  uint local_78 [4];
  uint local_68;
  int local_64;
  long local_60;
  int local_58 [4];
  int local_48;
  long local_38;
  
  local_64 = umve_idx;
  iVar11 = core->cu_scup;
  iVar12 = core->seqhdr->i_scu;
  pcVar1 = (core->map).map_scu;
  paasVar2 = (core->map).map_mv;
  pasVar3 = (core->map).map_refi;
  iVar8 = 1;
  if (umve_idx / 0x14 < 1) {
    iVar8 = umve_idx / 0x14;
  }
  local_58[0] = ((core->cu_height >> 2) + -1) * iVar12 + iVar11 + -1;
  iVar12 = iVar11 - iVar12;
  local_58[2] = (core->cu_width >> 2) + iVar12;
  local_58[1] = local_58[2] + -1;
  local_58[3] = iVar11 + -1;
  local_60 = (long)iVar12;
  local_48 = iVar12 + -1;
  local_78[0] = (byte)pcVar1[local_58[0]] >> 2 & 1;
  local_78[1] = (byte)pcVar1[(long)local_58[2] + -1] >> 2 & 1;
  local_78[2] = (byte)pcVar1[local_58[2]] >> 2 & 1;
  lVar18 = (long)(iVar11 + -1);
  local_78[3] = (byte)pcVar1[lVar18] >> 2 & 1;
  local_68 = (byte)pcVar1[local_60 + -1] >> 2 & 1;
  cVar6 = (char)local_78[1];
  if ((((byte)pcVar1[local_58[0]] >> 2 & 1) != 0) && (cVar6 != '\0')) {
    asVar21 = pasVar3[(long)local_58[2] + -1];
    local_78[1] = 1;
    if ((asVar21 == pasVar3[local_58[0]]) &&
       (((asVar21[0] == -1 ||
         (local_38 = lVar18, paasVar2[(long)local_58[2] + -1][0] == paasVar2[local_58[0]][0])) &&
        (local_78[1] = 0, (ushort)asVar21 < 0xff00)))) {
      local_78[1] = (uint)(paasVar2[(long)local_58[2] + -1][1] != paasVar2[local_58[0]][1]);
    }
  }
  if ((cVar6 != '\0') && ((char)local_78[2] != '\0')) {
    asVar21 = pasVar3[(long)local_58[2] + -1];
    local_78[2] = 1;
    if (((asVar21 == pasVar3[local_58[2]]) &&
        ((asVar21[0] == -1 || (paasVar2[(long)local_58[2] + -1][0] == paasVar2[local_58[2]][0]))))
       && (local_78[2] = 0, (ushort)asVar21 < 0xff00)) {
      local_78[2] = (uint)(paasVar2[(long)local_58[2] + -1][1] != paasVar2[local_58[2]][1]);
    }
  }
  cVar10 = (char)local_78[3];
  if (((char)local_78[0] != '\0') && (cVar10 != '\0')) {
    asVar21 = pasVar3[lVar18];
    local_78[3] = 1;
    if ((asVar21 == pasVar3[local_58[0]]) &&
       (((asVar21[0] == -1 || (paasVar2[lVar18][0] == paasVar2[local_58[0]][0])) &&
        (local_78[3] = 0, (ushort)asVar21 < 0xff00)))) {
      local_78[3] = (uint)(paasVar2[lVar18][1] != paasVar2[local_58[0]][1]);
    }
  }
  if ((char)local_68 != '\0') {
    if (cVar10 == '\0') {
      if (cVar6 == '\0') {
        bVar17 = true;
      }
      else {
        asVar21 = pasVar3[local_60 + -1];
        uVar4 = (ushort)asVar21 >> 8;
LAB_0010a10f:
        bVar17 = true;
        if ((asVar21 == pasVar3[(long)local_58[2] + -1]) &&
           ((asVar21[0] == -1 || (paasVar2[local_60 + -1][0] == paasVar2[(long)local_58[2] + -1][0])
            ))) {
          if (uVar4 == 0xff) goto LAB_0010a136;
          bVar17 = paasVar2[local_60 + -1][1] != paasVar2[(long)local_58[2] + -1][1];
        }
      }
    }
    else {
      asVar21 = pasVar3[local_60 + -1];
      uVar4 = (ushort)asVar21 >> 8;
      if ((asVar21 == pasVar3[lVar18]) &&
         ((asVar21[0] == -1 || (paasVar2[local_60 + -1][0] == paasVar2[lVar18][0])))) {
        if (uVar4 != 0xff) {
          bVar24 = paasVar2[local_60 + -1][1] == paasVar2[lVar18][1];
          goto LAB_0010a0e6;
        }
LAB_0010a136:
        bVar17 = false;
      }
      else {
        bVar24 = false;
LAB_0010a0e6:
        bVar17 = (bool)(bVar24 ^ 1);
        if ((bVar24 == false) && (cVar6 != '\0')) goto LAB_0010a10f;
      }
    }
    local_68 = (uint)bVar17;
  }
  iVar11 = umve_idx % 0x14;
  if (umve_idx < -0x13) {
    iVar12 = 0;
    bStack_81 = 0xff;
    local_82 = 0xff;
LAB_0010a1fc:
    if (iVar12 <= iVar8) {
      local_80[0] = 0;
      local_80[1] = 0;
      bStack_81 = 0xff;
      local_82 = 0;
    }
  }
  else {
    uVar13 = 0;
    bStack_81 = 0xff;
    local_82 = 0xff;
    iVar12 = 0;
    do {
      if (local_78[uVar13] != 0) {
        if (iVar12 == iVar8) {
          iVar16 = local_58[uVar13];
          if (-1 < pasVar3[iVar16][0]) {
            local_80 = paasVar2[iVar16][0];
            local_82 = pasVar3[iVar16][0];
          }
          if (-1 < pasVar3[iVar16][1]) {
            local_7c = paasVar2[iVar16][1];
            bStack_81 = pasVar3[iVar16][1];
          }
        }
        iVar12 = iVar12 + 1;
      }
    } while ((uVar13 < 4) && (uVar13 = uVar13 + 1, iVar12 <= iVar8));
    if (iVar8 < iVar12) goto LAB_0010a1fc;
    if (iVar12 != iVar8) {
      iVar12 = iVar12 + 1;
      goto LAB_0010a1fc;
    }
    derive_temporal_motions(core,&local_80,(s8 *)&local_82);
  }
  cVar6 = (char)(((byte)((char)iVar11 >> 7) >> 6) + (char)iVar11) >> 2;
  iVar12 = cVar6 * 4;
  iVar16 = iVar11 + cVar6 * -4;
  iVar8 = *(int *)(&DAT_001639d0 + (long)cVar6 * 4);
  core->refi[0] = -1;
  core->refi[1] = -1;
  psVar14 = core->refi + 1;
  if (((char)local_82 < '\0') || ((char)bStack_81 < '\0')) {
    if (-1 < (char)local_82) {
      if ((iVar11 == iVar12) || ((iVar11 = 0, iVar16 != 2 && (iVar8 = -iVar8, iVar16 == 1)))) {
        iVar11 = iVar8;
        iVar8 = 0;
      }
      iVar11 = local_80[0] + iVar11;
      iVar8 = local_80[1] + iVar8;
      if (0x7ffe < iVar11) {
        iVar11 = 0x7fff;
      }
      sVar15 = -0x8000;
      if (-0x8000 < iVar11) {
        sVar15 = (s16)iVar11;
      }
      psVar14 = core->refi;
      core->mv[0][0] = sVar15;
      lVar18 = 0x26;
      goto LAB_0010a448;
    }
    if ((char)bStack_81 < '\0') {
      return;
    }
    if ((iVar11 == iVar12) || ((iVar11 = 0, iVar16 != 2 && (iVar8 = -iVar8, iVar16 == 1)))) {
      iVar11 = iVar8;
      iVar8 = 0;
    }
    iVar11 = local_7c[0] + iVar11;
    iVar8 = local_7c[1] + iVar8;
    if (0x7ffe < iVar11) {
      iVar11 = 0x7fff;
    }
    sVar15 = -0x8000;
    if (-0x8000 < iVar11) {
      sVar15 = (s16)iVar11;
    }
    core->mv[1][0] = sVar15;
  }
  else {
    iVar7 = (int)core->refp[local_82][0].dist;
    uVar23 = iVar7 * 2;
    iVar22 = (int)core->refp[bStack_81][1].dist;
    uVar5 = iVar22 * 2;
    uVar19 = iVar22 * -2;
    if ((int)uVar19 < 0) {
      uVar19 = uVar5;
    }
    uVar20 = iVar7 * -2;
    if ((int)uVar20 < 0) {
      uVar20 = uVar23;
    }
    uVar23 = (int)(uVar5 * uVar23) >> 0x1f | 1;
    if (uVar19 < uVar20) {
      iVar22 = 0x4000;
      iVar7 = (int)(0x4000 / (ulong)uVar20) * uVar19;
      uVar19 = uVar23;
      uVar23 = 1;
    }
    else {
      iVar7 = 0x4000;
      iVar22 = (int)(0x4000 / (ulong)uVar19) * uVar20;
      uVar19 = 1;
    }
    iVar22 = (iVar22 * iVar8 + 0x2000 >> 0xe) * uVar23;
    if (0x7ffe < iVar22) {
      iVar22 = 0x7fff;
    }
    if (iVar22 < -0x7fff) {
      iVar22 = -0x8000;
    }
    iVar7 = (iVar7 * iVar8 + 0x2000 >> 0xe) * uVar19;
    if (0x7ffe < iVar7) {
      iVar7 = 0x7fff;
    }
    if (iVar7 < -0x7fff) {
      iVar7 = -0x8000;
    }
    if (iVar11 == iVar12) {
LAB_0010a367:
      iVar11 = iVar22;
      iVar22 = 0;
      iVar8 = 0;
    }
    else {
      iVar11 = 0;
      iVar8 = iVar7;
      if (iVar16 != 2) {
        iVar22 = -iVar22;
        iVar7 = -iVar7;
        iVar8 = iVar7;
        if (iVar16 == 1) goto LAB_0010a367;
      }
      iVar7 = 0;
    }
    iVar11 = local_80[0] + iVar11;
    iVar22 = local_80[1] + iVar22;
    if (0x7ffe < iVar11) {
      iVar11 = 0x7fff;
    }
    sVar15 = (s16)iVar11;
    if (iVar11 < -0x7fff) {
      sVar15 = -0x8000;
    }
    core->mv[0][0] = sVar15;
    if (0x7ffe < iVar22) {
      iVar22 = 0x7fff;
    }
    sVar15 = (s16)iVar22;
    if (iVar22 < -0x7fff) {
      sVar15 = -0x8000;
    }
    core->mv[0][1] = sVar15;
    core->refi[0] = local_82;
    iVar7 = local_7c[0] + iVar7;
    iVar8 = local_7c[1] + iVar8;
    if (0x7ffe < iVar7) {
      iVar7 = 0x7fff;
    }
    sVar15 = (s16)iVar7;
    if (iVar7 < -0x7fff) {
      sVar15 = -0x8000;
    }
    core->mv[1][0] = sVar15;
  }
  lVar18 = 0x2a;
  local_82 = bStack_81;
LAB_0010a448:
  iVar11 = 0x7fff;
  if (iVar8 < 0x7fff) {
    iVar11 = iVar8;
  }
  uVar9 = 0x8000;
  if (-0x8000 < iVar11) {
    uVar9 = (undefined2)iVar11;
  }
  *(undefined2 *)(core->cbfy + lVar18 + -0x14) = uVar9;
  *psVar14 = local_82;
  return;
}

Assistant:

void dec_derive_skip_mv_umve(com_core_t * core, int umve_idx)
{
    s16 pmv_base_cands[REFP_NUM][MV_D];
    s8  refi_base_cands[REFP_NUM];
    int base_idx = umve_idx / UMVE_MAX_REFINE_NUM;

    if (derive_umve_base_motions(core, base_idx, pmv_base_cands, refi_base_cands)) {
        derive_temporal_motions(core, pmv_base_cands, refi_base_cands);
    } 
    derive_umve_final_motions(core, umve_idx, pmv_base_cands, refi_base_cands);
}